

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void add_ref_mv_candidate
               (MB_MODE_INFO *candidate,MV_REFERENCE_FRAME *rf,uint8_t *refmv_count,
               uint8_t *ref_match_count,uint8_t *newmv_count,CANDIDATE_MV *ref_mv_stack,
               uint16_t *ref_mv_weight,int_mv *gm_mv_candidates,WarpedMotionParams *gm_params,
               uint16_t weight)

{
  int iVar1;
  int_mv iVar2;
  long lVar3;
  char *in_RCX;
  byte *in_RDX;
  char *in_RSI;
  MB_MODE_INFO *in_RDI;
  char *in_R8;
  long in_R9;
  long in_stack_00000008;
  int_mv this_refmv_1 [2];
  int_mv this_refmv;
  int is_gm_block;
  int ref;
  int index;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int_mv local_48;
  int local_44;
  int_mv local_40;
  int local_3c;
  int local_38;
  uint local_34;
  long local_30;
  char *local_28;
  char *local_20;
  byte *local_18;
  char *local_10;
  MB_MODE_INFO *local_8;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  iVar1 = is_inter_block((MB_MODE_INFO *)
                         CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  if (iVar1 != 0) {
    if (local_10[1] == -1) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        if (local_8->ref_frame[local_38] == *local_10) {
          local_3c = is_global_mv_block(local_8,*(TransformationType *)
                                                 (_this_refmv + (long)*local_10 * 0x24 + 0x20));
          if (local_3c == 0) {
            local_40 = get_block_mv(local_8,local_38);
          }
          else {
            local_40 = *(int_mv *)this_refmv_1;
          }
          for (local_34 = 0; (int)local_34 < (int)(uint)*local_18; local_34 = local_34 + 1) {
            if (*(uint32_t *)(local_30 + (long)(int)local_34 * 8) == local_40.as_int) {
              *(short *)(in_stack_00000008 + (long)(int)local_34 * 2) =
                   *(short *)(in_stack_00000008 + (long)(int)local_34 * 2) + (short)ref;
              break;
            }
          }
          if ((local_34 == *local_18) && (*local_18 < 8)) {
            ((int_mv *)(local_30 + (long)(int)local_34 * 8))->as_int = (uint32_t)local_40;
            *(short *)(in_stack_00000008 + (long)(int)local_34 * 2) = (short)ref;
            *local_18 = *local_18 + 1;
          }
          iVar1 = have_newmv_in_inter_mode(local_8->mode);
          if (iVar1 != 0) {
            *local_28 = *local_28 + '\x01';
          }
          *local_20 = *local_20 + '\x01';
        }
      }
    }
    else if ((local_8->ref_frame[0] == *local_10) && (local_8->ref_frame[1] == local_10[1])) {
      for (local_38 = 0; local_38 < 2; local_38 = local_38 + 1) {
        iVar1 = is_global_mv_block(local_8,*(TransformationType *)
                                            (_this_refmv + (long)local_10[local_38] * 0x24 + 0x20));
        if (iVar1 == 0) {
          lVar3 = (long)local_38;
          iVar2 = get_block_mv(local_8,local_38);
          (&local_48)[lVar3] = iVar2;
        }
        else {
          (&local_48)[local_38] = *(int_mv *)((long)this_refmv_1 + (long)local_38 * 4);
        }
      }
      for (local_34 = 0; (int)local_34 < (int)(uint)*local_18; local_34 = local_34 + 1) {
        if ((*(uint32_t *)(local_30 + (long)(int)local_34 * 8) == local_48.as_int) &&
           (*(int *)(local_30 + 4 + (long)(int)local_34 * 8) == local_44)) {
          *(short *)(in_stack_00000008 + (long)(int)local_34 * 2) =
               *(short *)(in_stack_00000008 + (long)(int)local_34 * 2) + (short)ref;
          break;
        }
      }
      if ((local_34 == *local_18) && (*local_18 < 8)) {
        ((int_mv *)(local_30 + (long)(int)local_34 * 8))->as_int = (uint32_t)local_48;
        *(int *)(local_30 + 4 + (long)(int)local_34 * 8) = local_44;
        *(short *)(in_stack_00000008 + (long)(int)local_34 * 2) = (short)ref;
        *local_18 = *local_18 + 1;
      }
      iVar1 = have_newmv_in_inter_mode(local_8->mode);
      if (iVar1 != 0) {
        *local_28 = *local_28 + '\x01';
      }
      *local_20 = *local_20 + '\x01';
    }
  }
  return;
}

Assistant:

static inline void add_ref_mv_candidate(
    const MB_MODE_INFO *const candidate, const MV_REFERENCE_FRAME rf[2],
    uint8_t *refmv_count, uint8_t *ref_match_count, uint8_t *newmv_count,
    CANDIDATE_MV *ref_mv_stack, uint16_t *ref_mv_weight,
    int_mv *gm_mv_candidates, const WarpedMotionParams *gm_params,
    uint16_t weight) {
  if (!is_inter_block(candidate)) return;
  assert(weight % 2 == 0);
  int index, ref;

  if (rf[1] == NONE_FRAME) {
    // single reference frame
    for (ref = 0; ref < 2; ++ref) {
      if (candidate->ref_frame[ref] == rf[0]) {
        const int is_gm_block =
            is_global_mv_block(candidate, gm_params[rf[0]].wmtype);
        const int_mv this_refmv =
            is_gm_block ? gm_mv_candidates[0] : get_block_mv(candidate, ref);
        for (index = 0; index < *refmv_count; ++index) {
          if (ref_mv_stack[index].this_mv.as_int == this_refmv.as_int) {
            ref_mv_weight[index] += weight;
            break;
          }
        }

        // Add a new item to the list.
        if (index == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
          ref_mv_stack[index].this_mv = this_refmv;
          ref_mv_weight[index] = weight;
          ++(*refmv_count);
        }
        if (have_newmv_in_inter_mode(candidate->mode)) ++*newmv_count;
        ++*ref_match_count;
      }
    }
  } else {
    // compound reference frame
    if (candidate->ref_frame[0] == rf[0] && candidate->ref_frame[1] == rf[1]) {
      int_mv this_refmv[2];

      for (ref = 0; ref < 2; ++ref) {
        if (is_global_mv_block(candidate, gm_params[rf[ref]].wmtype))
          this_refmv[ref] = gm_mv_candidates[ref];
        else
          this_refmv[ref] = get_block_mv(candidate, ref);
      }

      for (index = 0; index < *refmv_count; ++index) {
        if ((ref_mv_stack[index].this_mv.as_int == this_refmv[0].as_int) &&
            (ref_mv_stack[index].comp_mv.as_int == this_refmv[1].as_int)) {
          ref_mv_weight[index] += weight;
          break;
        }
      }

      // Add a new item to the list.
      if (index == *refmv_count && *refmv_count < MAX_REF_MV_STACK_SIZE) {
        ref_mv_stack[index].this_mv = this_refmv[0];
        ref_mv_stack[index].comp_mv = this_refmv[1];
        ref_mv_weight[index] = weight;
        ++(*refmv_count);
      }
      if (have_newmv_in_inter_mode(candidate->mode)) ++*newmv_count;
      ++*ref_match_count;
    }
  }
}